

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
* __thiscall
wallet::CWallet::GetScriptPubKeyMans
          (set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
           *__return_storage_ptr__,CWallet *this,CScript *script)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  char cVar3;
  int iVar4;
  const_iterator cVar5;
  _Base_ptr p_Var6;
  LegacyScriptPubKeyMan *pLVar7;
  long in_FS_OFFSET;
  SignatureData sigdata;
  LegacyScriptPubKeyMan *local_3d0;
  SignatureData local_3c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  cVar5 = std::
          _Hashtable<CScript,_std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_std::allocator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_cached_spks)._M_h,script);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::
    _Rb_tree<wallet::ScriptPubKeyMan*,wallet::ScriptPubKeyMan*,std::_Identity<wallet::ScriptPubKeyMan*>,std::less<wallet::ScriptPubKeyMan*>,std::allocator<wallet::ScriptPubKeyMan*>>
    ::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<wallet::ScriptPubKeyMan*const*,std::vector<wallet::ScriptPubKeyMan*,std::allocator<wallet::ScriptPubKeyMan*>>>>
              ((_Rb_tree<wallet::ScriptPubKeyMan*,wallet::ScriptPubKeyMan*,std::_Identity<wallet::ScriptPubKeyMan*>,std::less<wallet::ScriptPubKeyMan*>,std::allocator<wallet::ScriptPubKeyMan*>>
                *)__return_storage_ptr__,
               (__normal_iterator<wallet::ScriptPubKeyMan_*const_*,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>
                )*(ScriptPubKeyMan ***)
                  ((long)cVar5.
                         super__Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
                         ._M_cur + 0x28),
               (__normal_iterator<wallet::ScriptPubKeyMan_*const_*,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>
                )*(ScriptPubKeyMan ***)
                  ((long)cVar5.
                         super__Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
                         ._M_cur + 0x30));
  }
  local_3c8.complete = false;
  local_3c8.witness = false;
  p_Var2 = &local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header;
  local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&local_3c8.scriptSig,0,0xb8);
  local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_3c8.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_3c8.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var6 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; (_Rb_tree_header *)p_Var6 != p_Var1;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
    cVar3 = (**(code **)(**(long **)(p_Var6 + 1) + 0xb0))(*(long **)(p_Var6 + 1),script,&local_3c8);
    if (cVar3 == '\0') break;
  }
  pLVar7 = GetLegacyScriptPubKeyMan(this);
  if (pLVar7 != (LegacyScriptPubKeyMan *)0x0) {
    iVar4 = (*(pLVar7->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x16])
                      (pLVar7,script,&local_3c8);
    if ((char)iVar4 != '\0') {
      local_3d0 = pLVar7;
      std::
      _Rb_tree<wallet::ScriptPubKeyMan*,wallet::ScriptPubKeyMan*,std::_Identity<wallet::ScriptPubKeyMan*>,std::less<wallet::ScriptPubKeyMan*>,std::allocator<wallet::ScriptPubKeyMan*>>
      ::_M_insert_unique<wallet::ScriptPubKeyMan*>
                ((_Rb_tree<wallet::ScriptPubKeyMan*,wallet::ScriptPubKeyMan*,std::_Identity<wallet::ScriptPubKeyMan*>,std::less<wallet::ScriptPubKeyMan*>,std::allocator<wallet::ScriptPubKeyMan*>>
                  *)__return_storage_ptr__,(ScriptPubKeyMan **)&local_3d0);
    }
  }
  SignatureData::~SignatureData(&local_3c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::set<ScriptPubKeyMan*> CWallet::GetScriptPubKeyMans(const CScript& script) const
{
    std::set<ScriptPubKeyMan*> spk_mans;

    // Search the cache for relevant SPKMs instead of iterating m_spk_managers
    const auto& it = m_cached_spks.find(script);
    if (it != m_cached_spks.end()) {
        spk_mans.insert(it->second.begin(), it->second.end());
    }
    SignatureData sigdata;
    Assume(std::all_of(spk_mans.begin(), spk_mans.end(), [&script, &sigdata](ScriptPubKeyMan* spkm) { return spkm->CanProvide(script, sigdata); }));

    // Legacy wallet
    LegacyScriptPubKeyMan* spkm = GetLegacyScriptPubKeyMan();
    if (spkm && spkm->CanProvide(script, sigdata)) spk_mans.insert(spkm);

    return spk_mans;
}